

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::yyjson_mut_merge_patch
          (yyjson_mut_doc *doc,yyjson_mut_val *orig,yyjson_mut_val *patch)

{
  yyjson_val_pool *pool;
  void *pvVar1;
  long lVar2;
  int iVar3;
  yyjson_mut_val *pyVar4;
  yyjson_mut_val *pyVar5;
  yyjson_mut_val *pyVar6;
  yyjson_mut_val *pyVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  yyjson_mut_val *pyVar12;
  ulong uVar13;
  bool bVar14;
  yyjson_mut_val *local_78;
  yyjson_val_uni *local_60;
  yyjson_mut_val *local_50;
  yyjson_val_uni local_40;
  uint64_t local_38;
  
  if ((patch == (yyjson_mut_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
    pyVar7 = yyjson_mut_val_mut_copy(doc,patch);
    return pyVar7;
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    pool = &doc->val_pool;
    pyVar7 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar7) {
      bVar14 = unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
      if (!bVar14) {
        return (yyjson_mut_val *)0x0;
      }
      pyVar7 = pool->cur;
    }
    pool->cur = pyVar7 + 1;
    if (pyVar7 != (yyjson_mut_val *)0x0) {
      pyVar7->tag = 7;
      local_38 = 0;
      local_40.u64 = 0;
      if ((orig == (yyjson_mut_val *)0x0) || (uVar9 = orig->tag, (~(uint)uVar9 & 7) != 0)) {
        local_50 = (yyjson_mut_val *)&local_38;
        local_38 = 7;
        local_40 = pyVar7->uni;
        local_60 = &local_40;
      }
      else {
        local_60 = &orig->uni;
        pyVar5 = (yyjson_mut_val *)0x0;
        uVar8 = 0;
        local_78 = (yyjson_mut_val *)0x0;
        if (0xff < uVar9) {
          uVar8 = uVar9 >> 8;
          pyVar5 = *(yyjson_mut_val **)(*(long *)(local_60->u64 + 0x10) + 0x10);
          if (pyVar5 == (yyjson_mut_val *)0x0) {
            pyVar5 = (yyjson_mut_val *)0x0;
            local_78 = (yyjson_mut_val *)0x0;
          }
          else {
            local_78 = pyVar5->next;
          }
        }
        for (uVar9 = 0; local_50 = orig, uVar9 != uVar8; uVar9 = uVar9 + 1) {
          uVar11 = patch->tag;
          if ((((~(uint)uVar11 & 7) == 0) && (pvVar1 = (pyVar5->uni).ptr, pvVar1 != (void *)0x0)) &&
             (0xff < uVar11)) {
            uVar13 = pyVar5->tag >> 8;
            uVar11 = uVar11 >> 8;
            puVar10 = (ulong *)(patch->uni).u64;
            do {
              bVar14 = uVar11 == 0;
              uVar11 = uVar11 - 1;
              if (bVar14) goto LAB_01b88ab8;
              puVar10 = *(ulong **)(puVar10[2] + 0x10);
            } while ((*puVar10 >> 8 != uVar13) ||
                    (iVar3 = bcmp((void *)puVar10[1],pvVar1,uVar13), iVar3 != 0));
            if (puVar10[2] == 0) goto LAB_01b88ab8;
          }
          else {
LAB_01b88ab8:
            pyVar5 = yyjson_mut_val_mut_copy(doc,pyVar5);
            pyVar6 = yyjson_mut_val_mut_copy(doc,local_78);
            if (pyVar5 == (yyjson_mut_val *)0x0) {
              return (yyjson_mut_val *)0x0;
            }
            uVar11 = pyVar7->tag;
            if (((uint)uVar11 & 7) != 7) {
              return (yyjson_mut_val *)0x0;
            }
            if (pyVar6 == (yyjson_mut_val *)0x0) {
              return (yyjson_mut_val *)0x0;
            }
            if (((uint)pyVar5->tag & 7) != 5) {
              return (yyjson_mut_val *)0x0;
            }
            pyVar4 = pyVar5;
            if (0xff < uVar11) {
              lVar2 = *(long *)((pyVar7->uni).u64 + 0x10);
              pyVar4 = *(yyjson_mut_val **)(lVar2 + 0x10);
              *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar5;
            }
            pyVar6->next = pyVar4;
            pyVar5->next = pyVar6;
            (pyVar7->uni).str = (char *)pyVar5;
            pyVar7->tag = (uVar11 & 0xff) + (uVar11 & 0xffffffffffffff00) + 0x100;
          }
          pyVar5 = local_78->next;
          local_78 = pyVar5->next;
        }
      }
      uVar9 = patch->tag;
      pyVar5 = (yyjson_mut_val *)0x0;
      uVar8 = 0;
      pyVar6 = (yyjson_mut_val *)0x0;
      if ((~(uint)uVar9 & 7) == 0) {
        pyVar5 = (yyjson_mut_val *)0x0;
        uVar8 = 0;
        pyVar6 = (yyjson_mut_val *)0x0;
        if (0xff < uVar9) {
          uVar8 = uVar9 >> 8;
          pyVar5 = *(yyjson_mut_val **)(*(long *)((patch->uni).u64 + 0x10) + 0x10);
          if (pyVar5 == (yyjson_mut_val *)0x0) {
            pyVar5 = (yyjson_mut_val *)0x0;
            pyVar6 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar6 = pyVar5->next;
          }
        }
      }
      uVar9 = 0;
      do {
        if (uVar9 == uVar8) {
          return pyVar7;
        }
        if ((pyVar6->tag & 7) != 2) {
          pyVar4 = yyjson_mut_val_mut_copy(doc,pyVar5);
          uVar11 = local_50->tag;
          if (((~(uint)uVar11 & 7) == 0) && (pvVar1 = (pyVar5->uni).ptr, pvVar1 != (void *)0x0)) {
            pyVar12 = (yyjson_mut_val *)0x0;
            if (0xff < uVar11) {
              uVar13 = pyVar5->tag >> 8;
              uVar11 = uVar11 >> 8;
              puVar10 = (ulong *)local_60->u64;
              do {
                bVar14 = uVar11 == 0;
                uVar11 = uVar11 - 1;
                if (bVar14) {
                  pyVar12 = (yyjson_mut_val *)0x0;
                  goto LAB_01b88981;
                }
                puVar10 = *(ulong **)(puVar10[2] + 0x10);
              } while ((*puVar10 >> 8 != uVar13) ||
                      (iVar3 = bcmp((void *)puVar10[1],pvVar1,uVar13), iVar3 != 0));
              pyVar12 = (yyjson_mut_val *)puVar10[2];
            }
          }
          else {
            pyVar12 = (yyjson_mut_val *)0x0;
          }
LAB_01b88981:
          pyVar5 = yyjson_mut_merge_patch(doc,pyVar12,pyVar6);
          if (pyVar4 == (yyjson_mut_val *)0x0) {
            return (yyjson_mut_val *)0x0;
          }
          uVar11 = pyVar7->tag;
          if (((uint)uVar11 & 7) != 7) {
            return (yyjson_mut_val *)0x0;
          }
          if (pyVar5 == (yyjson_mut_val *)0x0) {
            return (yyjson_mut_val *)0x0;
          }
          if (((uint)pyVar4->tag & 7) != 5) {
            return (yyjson_mut_val *)0x0;
          }
          pyVar12 = pyVar4;
          if (0xff < uVar11) {
            lVar2 = *(long *)((pyVar7->uni).u64 + 0x10);
            pyVar12 = *(yyjson_mut_val **)(lVar2 + 0x10);
            *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar4;
          }
          pyVar5->next = pyVar12;
          pyVar4->next = pyVar5;
          (pyVar7->uni).str = (char *)pyVar4;
          pyVar7->tag = (uVar11 & 0xff) + (uVar11 & 0xffffffffffffff00) + 0x100;
        }
        uVar9 = uVar9 + 1;
        pyVar5 = pyVar6->next;
        pyVar6 = pyVar5->next;
      } while( true );
    }
  }
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_mut_merge_patch(yyjson_mut_doc *doc,
                                       yyjson_mut_val *orig,
                                       yyjson_mut_val *patch) {
    usize idx, max;
    yyjson_mut_val *key, *orig_val, *patch_val, local_orig;
    yyjson_mut_val *builder, *mut_key, *mut_val, *merged_val;

    if (unlikely(!yyjson_mut_is_obj(patch))) {
        return yyjson_mut_val_mut_copy(doc, patch);
    }

    builder = yyjson_mut_obj(doc);
    if (unlikely(!builder)) return NULL;

    memset(&local_orig, 0, sizeof(local_orig));
    if (!yyjson_mut_is_obj(orig)) {
        orig = &local_orig;
        orig->tag = builder->tag;
        orig->uni = builder->uni;
    }

    /* If orig is contributing, copy any items not modified by the patch */
    if (orig != &local_orig) {
        yyjson_mut_obj_foreach(orig, idx, max, key, orig_val) {
            patch_val = yyjson_mut_obj_getn(patch,
                                            unsafe_yyjson_get_str(key),
                                            unsafe_yyjson_get_len(key));
            if (!patch_val) {
                mut_key = yyjson_mut_val_mut_copy(doc, key);
                mut_val = yyjson_mut_val_mut_copy(doc, orig_val);
                if (!yyjson_mut_obj_add(builder, mut_key, mut_val)) return NULL;
            }
        }
    }

    /* Merge items modified by the patch. */
    yyjson_mut_obj_foreach(patch, idx, max, key, patch_val) {
        /* null indicates the field is removed. */
        if (unsafe_yyjson_is_null(patch_val)) {
            continue;
        }
        mut_key = yyjson_mut_val_mut_copy(doc, key);
        orig_val = yyjson_mut_obj_getn(orig,
                                       unsafe_yyjson_get_str(key),
                                       unsafe_yyjson_get_len(key));
        merged_val = yyjson_mut_merge_patch(doc, orig_val, patch_val);
        if (!yyjson_mut_obj_add(builder, mut_key, merged_val)) return NULL;
    }

    return builder;
}